

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O0

int LoudnessMeter::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  int iVar1;
  EffectData *pEVar2;
  EffectData *data;
  int numsamples_local;
  float *buffer_local;
  char *name_local;
  UnityAudioEffectState *state_local;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<LoudnessMeter::EffectData>(state);
  iVar1 = strcmp(name,"Momentary");
  if (iVar1 == 0) {
    LoudnessAnalyzer::ReadBuffer
              (&pEVar2->momentary,buffer,numsamples,pEVar2->p[0],
               (float)(state->field_0).field_0.samplerate,false);
  }
  iVar1 = strcmp(name,"MomentaryRMS");
  if (iVar1 == 0) {
    LoudnessAnalyzer::ReadBuffer
              (&pEVar2->momentary,buffer,numsamples,pEVar2->p[0],
               (float)(state->field_0).field_0.samplerate,true);
  }
  else {
    iVar1 = strcmp(name,"ShortTerm");
    if (iVar1 == 0) {
      LoudnessAnalyzer::ReadBuffer
                (&pEVar2->shortterm,buffer,numsamples,pEVar2->p[0],
                 (float)(state->field_0).field_0.samplerate,false);
    }
    else {
      iVar1 = strcmp(name,"ShortTermRMS");
      if (iVar1 == 0) {
        LoudnessAnalyzer::ReadBuffer
                  (&pEVar2->shortterm,buffer,numsamples,pEVar2->p[0],
                   (float)(state->field_0).field_0.samplerate,true);
      }
      else {
        iVar1 = strcmp(name,"Integrated");
        if (iVar1 == 0) {
          LoudnessAnalyzer::ReadBuffer
                    (&pEVar2->integrated,buffer,numsamples,pEVar2->p[0],
                     (float)(state->field_0).field_0.samplerate,false);
        }
        else {
          iVar1 = strcmp(name,"IntegratedRMS");
          if (iVar1 == 0) {
            LoudnessAnalyzer::ReadBuffer
                      (&pEVar2->integrated,buffer,numsamples,pEVar2->p[0],
                       (float)(state->field_0).field_0.samplerate,true);
          }
          else {
            memset(buffer,0,(long)numsamples << 2);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (strcmp(name, "Momentary") == 0)
            data->momentary.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, false);
        if (strcmp(name, "MomentaryRMS") == 0)
            data->momentary.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, true);
        else if (strcmp(name, "ShortTerm") == 0)
            data->shortterm.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, false);
        else if (strcmp(name, "ShortTermRMS") == 0)
            data->shortterm.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, true);
        else if (strcmp(name, "Integrated") == 0)
            data->integrated.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, false);
        else if (strcmp(name, "IntegratedRMS") == 0)
            data->integrated.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, true);
        else
            memset(buffer, 0, sizeof(float) * numsamples);
        return UNITY_AUDIODSP_OK;
    }